

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

string * __thiscall
enact::AstSerialise::visitEnumStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,EnumStmt *stmt)

{
  pointer pVVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  pointer pVVar4;
  string *psVar5;
  stringstream s;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  poVar3 = std::operator<<(local_1a8,"(Stmt::Enum ");
  poVar3 = std::operator<<(poVar3,(string *)&(stmt->name).lexeme);
  std::operator<<(poVar3," (");
  std::operator<<(local_1a8,") (\n");
  psVar5 = &this->m_ident;
  std::__cxx11::string::append((char *)psVar5);
  pVVar1 = (stmt->variants).
           super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pVVar4 = (stmt->variants).
                super__Vector_base<enact::EnumStmt::Variant,_std::allocator<enact::EnumStmt::Variant>_>
                ._M_impl.super__Vector_impl_data._M_start; pVVar4 != pVVar1; pVVar4 = pVVar4 + 1) {
    poVar3 = std::operator<<(local_1a8,(string *)psVar5);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = std::operator<<(poVar3,(string *)&(pVVar4->name).lexeme);
    poVar3 = std::operator<<(poVar3," ");
    iVar2 = (*((pVVar4->typename_)._M_t.
               super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
               .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename
              [4])();
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
    std::operator<<(poVar3,")\n");
  }
  std::__cxx11::string::erase((ulong)psVar5,0);
  std::operator<<(local_1a8,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitEnumStmt(EnumStmt &stmt) {
        std::stringstream s;
        s << "(Stmt::Enum " << stmt.name.lexeme << " (";

        s << ") (\n";
        m_ident += "    ";

        for (const EnumStmt::Variant& variant : stmt.variants) {
            s << m_ident << "(" << variant.name.lexeme << " " << variant.typename_->name() << ")\n";
        }

        m_ident.erase(0, 4);
        s << ")";

        return s.str();
    }